

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

PaddedSobolSampler *
pbrt::PaddedSobolSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int *piVar4;
  char *this;
  PaddedSobolSampler *pPVar5;
  char *in_RDI;
  string s;
  RandomizeStrategy randomizer;
  int nsamp;
  string *in_stack_fffffffffffffee8;
  ParameterDictionary *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffefe;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  ParameterDictionary *in_stack_ffffffffffffff48;
  allocator<char> local_99;
  string local_98 [32];
  string local_78 [32];
  undefined4 local_58;
  undefined1 local_41 [37];
  int local_1c;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_RDI,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  iVar3 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,0);
  std::__cxx11::string::~string((string *)(local_41 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  local_1c = iVar3;
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x18));
  if (bVar1) {
    piVar4 = pstd::optional<int>::operator*((optional<int> *)0x75d1e7);
    local_1c = *piVar4;
  }
  if ((*(byte *)(Options + 8) & 1) != 0) {
    local_1c = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_RDI,(allocator<char> *)CONCAT44(iVar3,in_stack_ffffffffffffff20));
  this = "owen";
  if (local_1c < 3) {
    this = "cranleypatterson";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_RDI,(allocator<char> *)CONCAT44(iVar3,in_stack_ffffffffffffff20));
  ParameterDictionary::GetOneString
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
  if ((bool)uVar2) {
    local_58 = 0;
  }
  else {
    in_stack_fffffffffffffefe =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
    if ((bool)in_stack_fffffffffffffefe) {
      local_58 = 1;
    }
    else {
      in_stack_fffffffffffffefd =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
      if ((bool)in_stack_fffffffffffffefd) {
        local_58 = 2;
      }
      else {
        in_stack_fffffffffffffefc =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8);
        if (!(bool)in_stack_fffffffffffffefc) {
          ErrorExit<std::__cxx11::string&>
                    ((FileLoc *)this_00,in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar3,in_stack_ffffffffffffff20));
        }
        local_58 = 3;
      }
    }
  }
  pPVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::PaddedSobolSampler,int&,pbrt::RandomizeStrategy&>
                     ((polymorphic_allocator<std::byte> *)this,
                      (int *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffefe,
                                                     CONCAT15(in_stack_fffffffffffffefd,
                                                              CONCAT14(in_stack_fffffffffffffefc,
                                                                       in_stack_fffffffffffffef8))))
                      ,(RandomizeStrategy *)in_stack_fffffffffffffef0);
  std::__cxx11::string::~string(local_78);
  return pPVar5;
}

Assistant:

PaddedSobolSampler *PaddedSobolSampler::Create(const ParameterDictionary &parameters,
                                               const FileLoc *loc, Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization",
                                            nsamp <= 2 ? "cranleypatterson" : "owen");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "cranleypatterson")
        randomizer = RandomizeStrategy::CranleyPatterson;
    else if (s == "xor")
        randomizer = RandomizeStrategy::Xor;
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to PaddedSobolSampler",
                  s);

    return alloc.new_object<PaddedSobolSampler>(nsamp, randomizer);
}